

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined4 in_register_0000003c;
  secp256k1_ge *r;
  ulong uVar69;
  long lVar70;
  secp256k1_fe *rzr;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_gej d;
  secp256k1_gej ai;
  secp256k1_ge d_ge;
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  r = (secp256k1_ge *)CONCAT44(in_register_0000003c,n);
  if ((int)z[3].n[0] == 0) {
    secp256k1_gej_double(&local_188,(secp256k1_gej *)z);
  }
  else {
    local_188.infinity = 1;
    local_188.x.n[0] = 0;
    local_188.x.n[1] = 0;
    local_188.x.n[2] = 0;
    local_188.x.n[3] = 0;
    local_188.x.n[4] = 0;
    local_188.y.n[0] = 0;
    local_188.y.n[1] = 0;
    local_188.y.n[2] = 0;
    local_188.y.n[3] = 0;
    local_188.y.n[4] = 0;
    local_188.z.n[0] = 0;
    local_188.z.n[1] = 0;
    local_188.z.n[2] = 0;
    local_188.z.n[3] = 0;
    local_188.z.n[4] = 0;
  }
  local_88.infinity = 0;
  local_88.x.n[0] = local_188.x.n[0];
  local_88.x.n[1] = local_188.x.n[1];
  local_88.x.n[2] = local_188.x.n[2];
  local_88.x.n[3] = local_188.x.n[3];
  local_88.x.n[4] = local_188.x.n[4];
  local_88.y.n[0] = local_188.y.n[0];
  local_88.y.n[1] = local_188.y.n[1];
  local_88.y.n[2] = local_188.y.n[2];
  local_88.y.n[3] = local_188.y.n[3];
  local_88.y.n[4] = local_188.y.n[4];
  secp256k1_ge_set_gej_zinv(r,(secp256k1_gej *)z,&local_188.z);
  local_108.infinity = r->infinity;
  local_108.x.n[0] = (r->x).n[0];
  local_108.x.n[1] = (r->x).n[1];
  local_108.x.n[2] = (r->x).n[2];
  local_108.x.n[3] = (r->x).n[3];
  local_108.x.n[4] = (r->x).n[4];
  local_108.y.n[0] = (r->y).n[0];
  local_108.y.n[1] = (r->y).n[1];
  local_108.y.n[2] = (r->y).n[2];
  local_108.y.n[3] = (r->y).n[3];
  local_108.y.n[4] = (r->y).n[4];
  local_108.z.n[4] = z[2].n[4];
  local_108.z.n[0] = z[2].n[0];
  local_108.z.n[1] = z[2].n[1];
  local_108.z.n[2] = z[2].n[2];
  local_108.z.n[3] = z[2].n[3];
  (pre_a->x).n[4] = local_188.z.n[4];
  (pre_a->x).n[2] = local_188.z.n[2];
  (pre_a->x).n[3] = local_188.z.n[3];
  (pre_a->x).n[0] = local_188.z.n[0];
  (pre_a->x).n[1] = local_188.z.n[1];
  rzr = &pre_a->y;
  lVar70 = 0xa8;
  do {
    secp256k1_gej_add_ge_var(&local_108,&local_108,&local_88,rzr);
    *(undefined4 *)((long)(r->x).n + lVar70) = 0;
    puVar1 = (uint64_t *)((long)(&r->x + -2) + lVar70);
    *puVar1 = local_108.x.n[0];
    puVar1[1] = local_108.x.n[1];
    puVar1 = (uint64_t *)((long)(r->x).n + lVar70 + -0x40);
    *puVar1 = local_108.x.n[2];
    puVar1[1] = local_108.x.n[3];
    *(uint64_t *)((long)(r->x).n + lVar70 + -0x30) = local_108.x.n[4];
    puVar1 = (uint64_t *)((long)(&r->x + -1) + lVar70);
    *puVar1 = local_108.y.n[0];
    puVar1[1] = local_108.y.n[1];
    puVar1 = (uint64_t *)((long)(r->x).n + lVar70 + -0x18);
    *puVar1 = local_108.y.n[2];
    puVar1[1] = local_108.y.n[3];
    *(uint64_t *)((long)(r->x).n + lVar70 + -8) = local_108.y.n[4];
    lVar70 = lVar70 + 0x58;
    rzr = rzr + 1;
  } while (lVar70 != 0x310);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_188.z.n[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_108.z.n[3];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_188.z.n[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_108.z.n[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_188.z.n[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_108.z.n[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_188.z.n[3];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_108.z.n[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_188.z.n[4];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_108.z.n[4];
  uVar66 = SUB168(auVar6 * auVar36,0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar66 & 0xfffffffffffff;
  auVar2 = auVar3 * auVar33 + auVar2 * auVar32 + auVar4 * auVar34 + auVar5 * auVar35 +
           auVar7 * ZEXT816(0x1000003d10);
  uVar67 = auVar2._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar67 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_188.z.n[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_108.z.n[4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_188.z.n[1];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_108.z.n[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_188.z.n[2];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_108.z.n[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_188.z.n[3];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_108.z.n[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_188.z.n[4];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_108.z.n[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar66 >> 0x34 | SUB168(auVar6 * auVar36,8) << 0xc;
  auVar2 = auVar8 * auVar37 + auVar58 + auVar9 * auVar38 + auVar10 * auVar39 + auVar11 * auVar40 +
           auVar12 * auVar41 + auVar13 * ZEXT816(0x1000003d10);
  uVar66 = auVar2._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar66 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_188.z.n[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_108.z.n[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_188.z.n[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_108.z.n[4];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_188.z.n[2];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_108.z.n[3];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_188.z.n[3];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_108.z.n[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_188.z.n[4];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_108.z.n[1];
  auVar2 = auVar15 * auVar43 + auVar60 + auVar16 * auVar44 + auVar17 * auVar45 + auVar18 * auVar46;
  uVar68 = auVar2._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar68 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = (uVar68 & 0xfffffffffffff) << 4 | (uVar66 & 0xfffffffffffff) >> 0x30;
  uVar68 = auVar59._0_8_;
  auVar59 = auVar14 * auVar42 + ZEXT816(0x1000003d1) * auVar47;
  zr->n[0] = uVar68 & 0xfffffffffffff;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar68 >> 0x34 | auVar59._8_8_ << 0xc;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_188.z.n[0];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_108.z.n[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_188.z.n[1];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_108.z.n[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_188.z.n[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_108.z.n[4];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_188.z.n[3];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_108.z.n[3];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_188.z.n[4];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_108.z.n[2];
  auVar3 = auVar21 * auVar50 + auVar62 + auVar22 * auVar51 + auVar23 * auVar52;
  uVar68 = auVar3._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar68 & 0xfffffffffffff;
  auVar2 = auVar19 * auVar48 + auVar61 + auVar20 * auVar49 + auVar24 * ZEXT816(0x1000003d10);
  uVar69 = auVar2._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar68 >> 0x34 | auVar3._8_8_ << 0xc;
  zr->n[1] = uVar69 & 0xfffffffffffff;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar69 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_188.z.n[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_108.z.n[2];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_188.z.n[1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_108.z.n[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_188.z.n[2];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_108.z.n[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_188.z.n[3];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_108.z.n[4];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_188.z.n[4];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_108.z.n[3];
  auVar3 = auVar28 * auVar56 + auVar64 + auVar29 * auVar57;
  uVar68 = auVar3._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar68 & 0xfffffffffffff;
  auVar2 = auVar25 * auVar53 + auVar63 + auVar26 * auVar54 + auVar27 * auVar55 +
           auVar30 * ZEXT816(0x1000003d10);
  uVar69 = auVar2._0_8_;
  zr->n[2] = uVar69 & 0xfffffffffffff;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = (uVar69 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar67 & 0xfffffffffffff);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar68 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar65 = auVar31 * ZEXT816(0x1000003d10) + auVar65;
  uVar67 = auVar65._0_8_;
  zr->n[3] = uVar67 & 0xfffffffffffff;
  zr->n[4] = (uVar67 >> 0x34 | auVar65._8_8_ << 0xc) + (uVar66 & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equvalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}